

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_attribute.cpp
# Opt level: O2

adios2_error adios2_attribute_data(void *data,size_t *size,adios2_attribute *attribute)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  pointer_____offset_0x10___ *ppuVar4;
  size_t __n;
  size_t e;
  ulong uVar5;
  long lVar6;
  char *dataT;
  allocator local_90 [32];
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"in call to adios2_attribute_data",local_90);
  adios2::helper::CheckForNullptr<adios2_attribute_const>(attribute,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string
            ((string *)&local_70,"for data, in call to adios2_attribute_data",local_90);
  adios2::helper::CheckForNullptr<void>(data,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  switch(*(undefined4 *)(attribute + 0x28)) {
  case 1:
    ppuVar4 = &adios2::core::Attribute<signed_char>::typeinfo;
    break;
  case 2:
    ppuVar4 = &adios2::core::Attribute<short>::typeinfo;
    goto LAB_00127b2e;
  case 3:
    ppuVar4 = &adios2::core::Attribute<int>::typeinfo;
    goto LAB_00127b61;
  case 4:
    ppuVar4 = &adios2::core::Attribute<long>::typeinfo;
    goto LAB_00127b92;
  case 5:
    ppuVar4 = &adios2::core::Attribute<unsigned_char>::typeinfo;
    break;
  case 6:
    ppuVar4 = &adios2::core::Attribute<unsigned_short>::typeinfo;
LAB_00127b2e:
    lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,ppuVar4,0);
    if (*(char *)(lVar1 + 0x38) == '\x01') {
      *(undefined2 *)data = *(undefined2 *)(lVar1 + 0x58);
      goto LAB_00127c08;
    }
    goto LAB_00127c0d;
  case 7:
    ppuVar4 = &adios2::core::Attribute<unsigned_int>::typeinfo;
LAB_00127b61:
    lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,ppuVar4,0);
    if (*(char *)(lVar1 + 0x38) == '\x01') {
      *(undefined4 *)data = *(undefined4 *)(lVar1 + 0x58);
      goto LAB_00127c08;
    }
    goto LAB_00127c0d;
  case 8:
    ppuVar4 = &adios2::core::Attribute<unsigned_long>::typeinfo;
LAB_00127b92:
    lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,ppuVar4,0);
    if (*(char *)(lVar1 + 0x38) == '\x01') {
      *(undefined8 *)data = *(undefined8 *)(lVar1 + 0x58);
      goto LAB_00127c08;
    }
    goto LAB_00127c0d;
  case 9:
    lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,
                           &adios2::core::Attribute<float>::typeinfo,0);
    if (*(char *)(lVar1 + 0x38) == '\x01') {
      *(undefined4 *)data = *(undefined4 *)(lVar1 + 0x58);
      goto LAB_00127c08;
    }
    goto LAB_00127c0d;
  case 10:
    lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,
                           &adios2::core::Attribute<double>::typeinfo,0);
    if (*(char *)(lVar1 + 0x38) != '\x01') goto LAB_00127c0d;
    *(undefined8 *)data = *(undefined8 *)(lVar1 + 0x58);
    goto LAB_00127c08;
  case 0xb:
    lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,
                           &adios2::core::Attribute<long_double>::typeinfo,0);
    if (*(char *)(lVar1 + 0x38) != '\x01') goto LAB_00127c0d;
    *(unkbyte10 *)data = *(unkbyte10 *)(lVar1 + 0x60);
    goto LAB_00127c08;
  default:
    goto switchD_00127a14_caseD_c;
  case 0xe:
    lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,
                           &adios2::core::Attribute<std::__cxx11::string>::typeinfo,0);
    if (*(char *)(lVar1 + 0x38) == '\x01') {
      std::__cxx11::string::copy((char *)(lVar1 + 0x58),(ulong)data,*(ulong *)(lVar1 + 0x60));
      *(undefined1 *)((long)data + *(long *)(lVar1 + 0x60)) = 0;
      *size = 1;
      return adios2_error_none;
    }
    uVar3 = *(ulong *)(lVar1 + 0x30);
    *size = uVar3;
    lVar6 = 0;
    for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
      std::__cxx11::string::copy
                ((char *)(*(long *)(lVar1 + 0x40) + lVar6),*(ulong *)((long)data + uVar5 * 8),
                 *(ulong *)(*(long *)(lVar1 + 0x40) + 8 + lVar6));
      *(undefined1 *)
       (*(long *)((long)data + uVar5 * 8) + *(long *)(*(long *)(lVar1 + 0x40) + 8 + lVar6)) = 0;
      uVar3 = *size;
      lVar6 = lVar6 + 0x20;
    }
    return adios2_error_none;
  case 0xf:
    ppuVar4 = &adios2::core::Attribute<char>::typeinfo;
  }
  lVar1 = __dynamic_cast(attribute,&adios2::core::AttributeBase::typeinfo,ppuVar4,0);
  if (*(char *)(lVar1 + 0x38) == '\x01') {
    *(undefined1 *)data = *(undefined1 *)(lVar1 + 0x58);
LAB_00127c08:
    sVar2 = 1;
  }
  else {
LAB_00127c0d:
    __n = *(long *)(lVar1 + 0x48) - (long)*(void **)(lVar1 + 0x40);
    if (__n != 0) {
      memmove(data,*(void **)(lVar1 + 0x40),__n);
    }
    sVar2 = *(size_t *)(lVar1 + 0x30);
  }
  *size = sVar2;
switchD_00127a14_caseD_c:
  return adios2_error_none;
}

Assistant:

adios2_error adios2_attribute_data(void *data, size_t *size, const adios2_attribute *attribute)
{
    try
    {
        adios2::helper::CheckForNullptr(attribute, "in call to adios2_attribute_data");
        adios2::helper::CheckForNullptr(data, "for data, in call to adios2_attribute_data");

        const adios2::core::AttributeBase *attributeBase =
            reinterpret_cast<const adios2::core::AttributeBase *>(attribute);

        const adios2::DataType type(attributeBase->m_Type);

        if (type == adios2::DataType::None)
        {
            // not supported
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            const adios2::core::Attribute<std::string> *attributeCpp =
                dynamic_cast<const adios2::core::Attribute<std::string> *>(attributeBase);
            if (attributeCpp->m_IsSingleValue)
            {
                char *dataT = reinterpret_cast<char *>(data);
                attributeCpp->m_DataSingleValue.copy(dataT, attributeCpp->m_DataSingleValue.size());
                dataT[attributeCpp->m_DataSingleValue.size()] = '\0';
                *size = 1;
            }
            else
            {
                *size = attributeCpp->m_Elements;
                char **dataT = reinterpret_cast<char **>(data);

                for (size_t e = 0; e < *size; ++e)
                {
                    attributeCpp->m_DataArray[e].copy(dataT[e],
                                                      attributeCpp->m_DataArray[e].size());
                    dataT[e][attributeCpp->m_DataArray[e].size()] = '\0';
                }
            }
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        const adios2::core::Attribute<T> *attributeCpp =                                           \
            dynamic_cast<const adios2::core::Attribute<T> *>(attributeBase);                       \
        T *dataT = reinterpret_cast<T *>(data);                                                    \
        if (attributeCpp->m_IsSingleValue)                                                         \
        {                                                                                          \
            *dataT = attributeCpp->m_DataSingleValue;                                              \
            *size = 1;                                                                             \
        }                                                                                          \
        else                                                                                       \
        {                                                                                          \
            std::copy(attributeCpp->m_DataArray.begin(), attributeCpp->m_DataArray.end(), dataT);  \
            *size = attributeCpp->m_Elements;                                                      \
        }                                                                                          \
    }
        ADIOS2_FOREACH_ATTRIBUTE_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_attribute_data"));
    }
}